

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLcode Curl_multi_xfer_ulbuf_borrow(Curl_easy *data,char **pbuf,size_t *pbuflen)

{
  ulong uVar1;
  char *pcVar2;
  Curl_multi *pCVar3;
  
  *pbuf = (char *)0x0;
  *pbuflen = 0;
  pCVar3 = data->multi;
  if (pCVar3 == (Curl_multi *)0x0) {
    pcVar2 = "transfer has no multi handle";
LAB_0014694d:
    Curl_failf(data,pcVar2);
    return CURLE_FAILED_INIT;
  }
  uVar1 = (ulong)(data->set).upload_buffer_size;
  if (uVar1 == 0) {
    pcVar2 = "transfer upload buffer size is 0";
    goto LAB_0014694d;
  }
  if ((pCVar3->field_0x271 & 0x40) != 0) {
    Curl_failf(data,"attempt to borrow xfer_ulbuf when already borrowed");
    return CURLE_AGAIN;
  }
  if (pCVar3->xfer_ulbuf != (char *)0x0) {
    if (uVar1 <= pCVar3->xfer_ulbuf_len) goto LAB_00146916;
    (*Curl_cfree)(pCVar3->xfer_ulbuf);
    pCVar3 = data->multi;
    pCVar3->xfer_ulbuf = (char *)0x0;
    pCVar3->xfer_ulbuf_len = 0;
  }
  pcVar2 = (char *)(*Curl_cmalloc)((ulong)(data->set).upload_buffer_size);
  pCVar3 = data->multi;
  pCVar3->xfer_ulbuf = pcVar2;
  if (pcVar2 == (char *)0x0) {
    Curl_failf(data,"could not allocate xfer_ulbuf of %zu bytes");
    return CURLE_OUT_OF_MEMORY;
  }
  pCVar3->xfer_ulbuf_len = (ulong)(data->set).upload_buffer_size;
LAB_00146916:
  pCVar3->field_0x271 = pCVar3->field_0x271 | 0x40;
  *pbuf = data->multi->xfer_ulbuf;
  *pbuflen = data->multi->xfer_ulbuf_len;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_multi_xfer_ulbuf_borrow(struct Curl_easy *data,
                                      char **pbuf, size_t *pbuflen)
{
  DEBUGASSERT(data);
  DEBUGASSERT(data->multi);
  *pbuf = NULL;
  *pbuflen = 0;
  if(!data->multi) {
    failf(data, "transfer has no multi handle");
    return CURLE_FAILED_INIT;
  }
  if(!data->set.upload_buffer_size) {
    failf(data, "transfer upload buffer size is 0");
    return CURLE_FAILED_INIT;
  }
  if(data->multi->xfer_ulbuf_borrowed) {
    failf(data, "attempt to borrow xfer_ulbuf when already borrowed");
    return CURLE_AGAIN;
  }

  if(data->multi->xfer_ulbuf &&
     data->set.upload_buffer_size > data->multi->xfer_ulbuf_len) {
    /* not large enough, get a new one */
    free(data->multi->xfer_ulbuf);
    data->multi->xfer_ulbuf = NULL;
    data->multi->xfer_ulbuf_len = 0;
  }

  if(!data->multi->xfer_ulbuf) {
    data->multi->xfer_ulbuf = malloc((size_t)data->set.upload_buffer_size);
    if(!data->multi->xfer_ulbuf) {
      failf(data, "could not allocate xfer_ulbuf of %zu bytes",
            (size_t)data->set.upload_buffer_size);
      return CURLE_OUT_OF_MEMORY;
    }
    data->multi->xfer_ulbuf_len = data->set.upload_buffer_size;
  }

  data->multi->xfer_ulbuf_borrowed = TRUE;
  *pbuf = data->multi->xfer_ulbuf;
  *pbuflen = data->multi->xfer_ulbuf_len;
  return CURLE_OK;
}